

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::IEEEFloat::toString
          (IEEEFloat *this,SmallVectorImpl<char> *Str,uint FormatPrecision,uint FormatMaxPadding,
          bool TruncateZero)

{
  APInt *this_00;
  anon_unknown_5 *paVar1;
  SmallVectorImpl<char> *pSVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  integerPart *data;
  uint64_t uVar8;
  size_t sVar9;
  ulong uVar10;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  AlignedCharArray<1UL,_1UL> local_499;
  undefined1 local_489;
  bool local_456;
  char local_39d;
  uint local_39c;
  char local_396 [2];
  uint Z;
  char local_38d;
  uint NZeros;
  uint local_388;
  uint I;
  int NWholeDigits;
  int local_37c;
  uint I_4;
  uint I_3;
  uint local_370;
  uint E;
  uint I_2;
  SmallVector<char,_6U> expbuf;
  int local_348;
  char local_342 [2];
  uint I_1;
  bool local_339;
  int MSD;
  bool FormatScientific;
  uint NDigits;
  byte local_329;
  uint d;
  bool inTrail;
  APInt digit;
  APInt ten;
  undefined1 auStack_300 [4];
  uint precision;
  SmallVector<char,_256U> buffer;
  APInt five_to_the_i;
  uint local_1cc;
  uint precision_1;
  int texp;
  uint local_1b4;
  undefined1 auStack_1b0 [4];
  int trailingZeros;
  undefined1 local_1a0 [8];
  APInt significand;
  int exp;
  char local_171;
  SmallVectorImpl<char> *local_170 [2];
  SmallVectorImpl<char> *local_160 [2];
  char local_149;
  SmallVectorImpl<char> *local_148 [2];
  SmallVectorImpl<char> *local_138 [2];
  SmallVectorImpl<char> *local_128 [2];
  byte local_111;
  uint local_110;
  uint uStack_10c;
  bool TruncateZero_local;
  uint FormatMaxPadding_local;
  uint FormatPrecision_local;
  SmallVectorImpl<char> *Str_local;
  IEEEFloat *this_local;
  SmallVectorImpl<char> **local_f0;
  char *local_e8;
  SmallVectorImpl<char> **local_e0;
  char *local_d8;
  SmallVectorImpl<char> **local_d0;
  char *local_c8;
  SmallVectorImpl<char> **local_c0;
  char *local_b8;
  SmallVectorImpl<char> **local_b0;
  char *local_a8;
  int *local_a0;
  ulong local_98;
  SmallVectorBase *local_90;
  ulong local_88;
  SmallVectorBase *local_80;
  ulong local_78;
  SmallVectorBase *local_70;
  ulong local_68;
  SmallVectorBase *local_60;
  ulong local_58;
  SmallVectorBase *local_50;
  ulong local_48;
  SmallVectorBase *local_40;
  SmallVectorBase *local_38;
  SmallVectorBase *local_30;
  SmallVectorBase *local_28;
  SmallVectorBase *local_20;
  SmallVectorBase *local_18;
  SmallVectorBase *local_10;
  
  local_111 = TruncateZero;
  local_110 = FormatMaxPadding;
  uStack_10c = FormatPrecision;
  _FormatMaxPadding_local = (anon_unknown_5 *)Str;
  Str_local = (SmallVectorImpl<char> *)this;
  switch(this->field_0x12 & 7) {
  case 0:
    bVar3 = isNegative(this);
    paVar1 = _FormatMaxPadding_local;
    if (bVar3) {
      local_f0 = local_128;
      this_local = (IEEEFloat *)anon_var_dwarf_281a45;
      local_128[0] = (SmallVectorImpl<char> *)0x2f29b4;
      pcVar7 = (char *)strlen("-Inf");
      Str_00.Length = (size_t)pcVar7;
      Str_00.Data = pcVar7;
      anon_unknown_5::append(paVar1,local_128[0],Str_00);
    }
    else {
      local_e0 = local_138;
      local_e8 = "+Inf";
      local_138[0] = (SmallVectorImpl<char> *)0x2f29a0;
      pcVar7 = (char *)strlen("+Inf");
      Str_01.Length = (size_t)pcVar7;
      Str_01.Data = pcVar7;
      anon_unknown_5::append(paVar1,local_138[0],Str_01);
    }
    break;
  case 1:
    local_d0 = local_148;
    local_d8 = "NaN";
    local_148[0] = (SmallVectorImpl<char> *)0x2f29bf;
    pcVar7 = (char *)strlen("NaN");
    Str_02.Length = (size_t)pcVar7;
    Str_02.Data = pcVar7;
    anon_unknown_5::append((anon_unknown_5 *)Str,local_148[0],Str_02);
    break;
  case 2:
  default:
    bVar3 = isNegative(this);
    if (bVar3) {
      significand._14_1_ = 0x2d;
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,
                 &significand.field_0xe);
    }
    significand.BitWidth = (int)this->exponent - (this->semantics->precision - 1);
    uVar6 = this->semantics->precision;
    data = significandParts(this);
    uVar4 = partCountForBits(this->semantics->precision);
    _auStack_1b0 = makeArrayRef<unsigned_long>(data,(ulong)uVar4);
    APInt::APInt((APInt *)local_1a0,uVar6,_auStack_1b0);
    if (uStack_10c == 0) {
      uStack_10c = (this->semantics->precision * 0x3b) / 0xc4 + 2;
    }
    local_1b4 = APInt::countTrailingZeros((APInt *)local_1a0);
    significand.BitWidth = local_1b4 + significand.BitWidth;
    APInt::lshrInPlace((APInt *)local_1a0,local_1b4);
    if (significand.BitWidth != 0) {
      if ((int)significand.BitWidth < 1) {
        local_1cc = -significand.BitWidth;
        uVar6 = this->semantics->precision;
        iVar5 = significand.BitWidth * -0x89;
        APInt::zext((APInt *)&five_to_the_i.BitWidth,(uint)local_1a0);
        APInt::operator=((APInt *)local_1a0,(APInt *)&five_to_the_i.BitWidth);
        APInt::~APInt((APInt *)&five_to_the_i.BitWidth);
        APInt::APInt((APInt *)(buffer.super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),
                     uVar6 + (iVar5 + 0x88) / 0x3b,5,false);
        while( true ) {
          if ((local_1cc & 1) != 0) {
            APInt::operator*=((APInt *)local_1a0,
                              (APInt *)(buffer.super_SmallVectorStorage<char,_256U>.InlineElts +
                                       0xf8));
          }
          local_1cc = (int)local_1cc >> 1;
          if (local_1cc == 0) break;
          this_00 = (APInt *)(buffer.super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8);
          APInt::operator*=(this_00,this_00);
        }
        APInt::~APInt((APInt *)(buffer.super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
      }
      else {
        APInt::zext((APInt *)&precision_1,(uint)local_1a0);
        APInt::operator=((APInt *)local_1a0,(APInt *)&precision_1);
        APInt::~APInt((APInt *)&precision_1);
        APInt::operator<<=((APInt *)local_1a0,significand.BitWidth);
        significand.BitWidth = 0;
      }
    }
    anon_unknown_5::AdjustToPrecision((APInt *)local_1a0,(int *)&significand.BitWidth,uStack_10c);
    SmallVector<char,_256U>::SmallVector((SmallVector<char,_256U> *)auStack_300);
    uVar6 = APInt::getBitWidth((APInt *)local_1a0);
    APInt::APInt((APInt *)&digit.BitWidth,uVar6,10,false);
    APInt::APInt((APInt *)&d,uVar6,0,false);
    local_329 = 1;
    while (bVar3 = APInt::operator!=((APInt *)local_1a0,0), bVar3) {
      APInt::udivrem((APInt *)local_1a0,(APInt *)&digit.BitWidth,(APInt *)local_1a0,(APInt *)&d);
      uVar8 = APInt::getZExtValue((APInt *)&d);
      NDigits = (uint)uVar8;
      if (((local_329 & 1) == 0) || (NDigits != 0)) {
        FormatScientific = (bool)((char)uVar8 + '0');
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)auStack_300,&FormatScientific);
        local_329 = 0;
      }
      else {
        significand.BitWidth = significand.BitWidth + 1;
      }
    }
    bVar3 = SmallVectorBase::empty((SmallVectorBase *)auStack_300);
    if (bVar3) {
      __assert_fail("!buffer.empty() && \"no characters in buffer!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xdbd,
                    "void llvm::detail::IEEEFloat::toString(SmallVectorImpl<char> &, unsigned int, unsigned int, bool) const"
                   );
    }
    anon_unknown_5::AdjustToPrecision
              ((SmallVectorImpl<char> *)auStack_300,(int *)&significand.BitWidth,uStack_10c);
    sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
    pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local;
    MSD = (int)sVar9;
    if (local_110 == 0) {
      local_339 = true;
    }
    else if ((int)significand.BitWidth < 0) {
      I_1 = significand.BitWidth + MSD + -1;
      local_339 = (int)I_1 < 0 && local_110 < -I_1;
    }
    else {
      local_456 = local_110 < significand.BitWidth || uStack_10c < MSD + significand.BitWidth;
      local_339 = local_456;
    }
    if (local_339 == false) {
      if ((int)significand.BitWidth < 0) {
        local_388 = significand.BitWidth + MSD;
        NZeros = 0;
        if ((int)local_388 < 1) {
          Z = 1 - local_388;
          local_396[1] = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,local_396 + 1);
          local_396[0] = '.';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,local_396);
          for (local_39c = 1; local_39c != Z; local_39c = local_39c + 1) {
            local_39d = '0';
            SmallVectorTemplateBase<char,_true>::push_back
                      ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,&local_39d);
          }
        }
        else {
          for (; pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local, NZeros != local_388;
              NZeros = NZeros + 1) {
            uVar10 = (ulong)((MSD - NZeros) - 1);
            local_88 = uVar10;
            local_80 = (SmallVectorBase *)auStack_300;
            sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
            if (sVar9 <= uVar10) {
              __assert_fail("idx < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                            ,0x9b,
                            "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                           );
            }
            local_18 = (SmallVectorBase *)auStack_300;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((long)_auStack_300 + local_88));
          }
          local_38d = '.';
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,&local_38d);
        }
        for (; pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local, NZeros != MSD;
            NZeros = NZeros + 1) {
          uVar10 = (ulong)((MSD - NZeros) - 1);
          local_98 = uVar10;
          local_90 = (SmallVectorBase *)auStack_300;
          sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
          if (sVar9 <= uVar10) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          local_10 = (SmallVectorBase *)auStack_300;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((long)_auStack_300 + local_98));
        }
        I_4 = 0;
      }
      else {
        for (local_37c = 0; pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local,
            local_37c != MSD; local_37c = local_37c + 1) {
          uVar10 = (ulong)(uint)((MSD + -1) - local_37c);
          local_78 = uVar10;
          local_70 = (SmallVectorBase *)auStack_300;
          sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
          if (sVar9 <= uVar10) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          local_20 = (SmallVectorBase *)auStack_300;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((long)_auStack_300 + local_78));
        }
        for (NWholeDigits = 0; NWholeDigits != significand.BitWidth; NWholeDigits = NWholeDigits + 1
            ) {
          I._3_1_ = 0x30;
          SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,
                     (char *)((long)&I + 3));
        }
        I_4 = 1;
      }
    }
    else {
      significand.BitWidth = MSD + -1 + significand.BitWidth;
      uVar6 = MSD - 1;
      local_48 = (ulong)uVar6;
      local_40 = (SmallVectorBase *)auStack_300;
      sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
      if (sVar9 <= uVar6) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      local_38 = (SmallVectorBase *)auStack_300;
      SmallVectorTemplateBase<char,_true>::push_back
                (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                 (char *)((long)_auStack_300 + local_48));
      local_342[1] = 0x2e;
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,local_342 + 1);
      if ((MSD == 1) && ((local_111 & 1) != 0)) {
        local_342[0] = '0';
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,local_342);
      }
      else {
        for (local_348 = 1; pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local,
            local_348 != MSD; local_348 = local_348 + 1) {
          uVar10 = (ulong)(uint)((MSD + -1) - local_348);
          local_58 = uVar10;
          local_50 = (SmallVectorBase *)auStack_300;
          sVar9 = SmallVectorBase::size((SmallVectorBase *)auStack_300);
          if (sVar9 <= uVar10) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          local_30 = (SmallVectorBase *)auStack_300;
          SmallVectorTemplateBase<char,_true>::push_back
                    (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                     (char *)((long)_auStack_300 + local_58));
        }
      }
      if (((local_111 & 1) == 0) && (MSD - 1U < uStack_10c)) {
        expbuf._23_1_ = 0x30;
        SmallVectorImpl<char>::append
                  ((SmallVectorImpl<char> *)_FormatMaxPadding_local,(ulong)((uStack_10c - MSD) + 1),
                   &expbuf.field_0x17);
      }
      local_489 = 0x45;
      if ((local_111 & 1) == 0) {
        local_489 = 0x65;
      }
      expbuf._22_1_ = local_489;
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,&expbuf.field_0x16);
      local_499.buffer[0] = (char  [1])'+';
      if ((int)significand.BitWidth < 0) {
        local_499.buffer[0] = (char  [1])'-';
      }
      expbuf.super_SmallVectorStorage<char,_6U>.InlineElts[5].super_AlignedCharArray<1UL,_1UL>.
      buffer[0] = (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)local_499.buffer[0];
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,
                 (char *)(expbuf.super_SmallVectorStorage<char,_6U>.InlineElts + 5));
      if ((int)significand.BitWidth < 0) {
        significand.BitWidth = -significand.BitWidth;
      }
      SmallVector<char,_6U>::SmallVector((SmallVector<char,_6U> *)&I_2);
      do {
        E._3_1_ = (char)((int)significand.BitWidth % 10) + '0';
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&I_2,(char *)((long)&E + 3));
        significand.BitWidth = (int)significand.BitWidth / 10;
      } while (significand.BitWidth != 0);
      if (((local_111 & 1) == 0) &&
         (sVar9 = SmallVectorBase::size((SmallVectorBase *)&I_2), sVar9 < 2)) {
        E._2_1_ = 0x30;
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)&I_2,(char *)((long)&E + 2));
      }
      local_370 = 0;
      sVar9 = SmallVectorBase::size((SmallVectorBase *)&I_2);
      I_3 = (uint)sVar9;
      for (; pSVar2 = (SmallVectorImpl<char> *)_FormatMaxPadding_local, local_370 != I_3;
          local_370 = local_370 + 1) {
        uVar10 = (ulong)((I_3 - 1) - local_370);
        local_68 = uVar10;
        local_60 = (SmallVectorBase *)&I_2;
        sVar9 = SmallVectorBase::size((SmallVectorBase *)&I_2);
        if (sVar9 <= uVar10) {
          __assert_fail("idx < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                        ,0x9b,
                        "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                       );
        }
        local_28 = (SmallVectorBase *)&I_2;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&pSVar2->super_SmallVectorTemplateBase<char,_true>,
                   (char *)((long)_I_2 + local_68));
      }
      I_4 = 1;
      SmallVector<char,_6U>::~SmallVector((SmallVector<char,_6U> *)&I_2);
    }
    APInt::~APInt((APInt *)&d);
    APInt::~APInt((APInt *)&digit.BitWidth);
    SmallVector<char,_256U>::~SmallVector((SmallVector<char,_256U> *)auStack_300);
    APInt::~APInt((APInt *)local_1a0);
    break;
  case 3:
    bVar3 = isNegative(this);
    if (bVar3) {
      local_149 = '-';
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,&local_149);
    }
    paVar1 = _FormatMaxPadding_local;
    if (local_110 == 0) {
      if ((local_111 & 1) == 0) {
        local_b0 = local_170;
        local_b8 = "0.0";
        local_170[0] = (SmallVectorImpl<char> *)0x2f3303;
        pcVar7 = (char *)strlen("0.0");
        Str_04.Length = (size_t)pcVar7;
        Str_04.Data = pcVar7;
        anon_unknown_5::append(paVar1,local_170[0],Str_04);
        if (1 < uStack_10c) {
          local_171 = '0';
          SmallVectorImpl<char>::append
                    ((SmallVectorImpl<char> *)_FormatMaxPadding_local,(ulong)(uStack_10c - 1),
                     &local_171);
        }
        paVar1 = _FormatMaxPadding_local;
        local_a0 = &exp;
        local_a8 = "e+00";
        _exp = "e+00";
        pcVar7 = (char *)strlen("e+00");
        Str_05.Length = (size_t)pcVar7;
        Str_05.Data = pcVar7;
        anon_unknown_5::append(paVar1,(SmallVectorImpl<char> *)_exp,Str_05);
      }
      else {
        local_c0 = local_160;
        local_c8 = "0.0E+0";
        local_160[0] = (SmallVectorImpl<char> *)0x2f32fc;
        pcVar7 = (char *)strlen("0.0E+0");
        Str_03.Length = (size_t)pcVar7;
        Str_03.Data = pcVar7;
        anon_unknown_5::append(paVar1,local_160[0],Str_03);
      }
    }
    else {
      significand._15_1_ = 0x30;
      SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)_FormatMaxPadding_local,
                 &significand.field_0xf);
    }
  }
  return;
}

Assistant:

void IEEEFloat::toString(SmallVectorImpl<char> &Str, unsigned FormatPrecision,
                         unsigned FormatMaxPadding, bool TruncateZero) const {
  switch (category) {
  case fcInfinity:
    if (isNegative())
      return append(Str, "-Inf");
    else
      return append(Str, "+Inf");

  case fcNaN: return append(Str, "NaN");

  case fcZero:
    if (isNegative())
      Str.push_back('-');

    if (!FormatMaxPadding) {
      if (TruncateZero)
        append(Str, "0.0E+0");
      else {
        append(Str, "0.0");
        if (FormatPrecision > 1)
          Str.append(FormatPrecision - 1, '0');
        append(Str, "e+00");
      }
    } else
      Str.push_back('0');
    return;

  case fcNormal:
    break;
  }

  if (isNegative())
    Str.push_back('-');

  // Decompose the number into an APInt and an exponent.
  int exp = exponent - ((int) semantics->precision - 1);
  APInt significand(semantics->precision,
                    makeArrayRef(significandParts(),
                                 partCountForBits(semantics->precision)));

  // Set FormatPrecision if zero.  We want to do this before we
  // truncate trailing zeros, as those are part of the precision.
  if (!FormatPrecision) {
    // We use enough digits so the number can be round-tripped back to an
    // APFloat. The formula comes from "How to Print Floating-Point Numbers
    // Accurately" by Steele and White.
    // FIXME: Using a formula based purely on the precision is conservative;
    // we can print fewer digits depending on the actual value being printed.

    // FormatPrecision = 2 + floor(significandBits / lg_2(10))
    FormatPrecision = 2 + semantics->precision * 59 / 196;
  }

  // Ignore trailing binary zeros.
  int trailingZeros = significand.countTrailingZeros();
  exp += trailingZeros;
  significand.lshrInPlace(trailingZeros);

  // Change the exponent from 2^e to 10^e.
  if (exp == 0) {
    // Nothing to do.
  } else if (exp > 0) {
    // Just shift left.
    significand = significand.zext(semantics->precision + exp);
    significand <<= exp;
    exp = 0;
  } else { /* exp < 0 */
    int texp = -exp;

    // We transform this using the identity:
    //   (N)(2^-e) == (N)(5^e)(10^-e)
    // This means we have to multiply N (the significand) by 5^e.
    // To avoid overflow, we have to operate on numbers large
    // enough to store N * 5^e:
    //   log2(N * 5^e) == log2(N) + e * log2(5)
    //                 <= semantics->precision + e * 137 / 59
    //   (log_2(5) ~ 2.321928 < 2.322034 ~ 137/59)

    unsigned precision = semantics->precision + (137 * texp + 136) / 59;

    // Multiply significand by 5^e.
    //   N * 5^0101 == N * 5^(1*1) * 5^(0*2) * 5^(1*4) * 5^(0*8)
    significand = significand.zext(precision);
    APInt five_to_the_i(precision, 5);
    while (true) {
      if (texp & 1) significand *= five_to_the_i;

      texp >>= 1;
      if (!texp) break;
      five_to_the_i *= five_to_the_i;
    }
  }

  AdjustToPrecision(significand, exp, FormatPrecision);

  SmallVector<char, 256> buffer;

  // Fill the buffer.
  unsigned precision = significand.getBitWidth();
  APInt ten(precision, 10);
  APInt digit(precision, 0);

  bool inTrail = true;
  while (significand != 0) {
    // digit <- significand % 10
    // significand <- significand / 10
    APInt::udivrem(significand, ten, significand, digit);

    unsigned d = digit.getZExtValue();

    // Drop trailing zeros.
    if (inTrail && !d) exp++;
    else {
      buffer.push_back((char) ('0' + d));
      inTrail = false;
    }
  }

  assert(!buffer.empty() && "no characters in buffer!");

  // Drop down to FormatPrecision.
  // TODO: don't do more precise calculations above than are required.
  AdjustToPrecision(buffer, exp, FormatPrecision);

  unsigned NDigits = buffer.size();

  // Check whether we should use scientific notation.
  bool FormatScientific;
  if (!FormatMaxPadding)
    FormatScientific = true;
  else {
    if (exp >= 0) {
      // 765e3 --> 765000
      //              ^^^
      // But we shouldn't make the number look more precise than it is.
      FormatScientific = ((unsigned) exp > FormatMaxPadding ||
                          NDigits + (unsigned) exp > FormatPrecision);
    } else {
      // Power of the most significant digit.
      int MSD = exp + (int) (NDigits - 1);
      if (MSD >= 0) {
        // 765e-2 == 7.65
        FormatScientific = false;
      } else {
        // 765e-5 == 0.00765
        //           ^ ^^
        FormatScientific = ((unsigned) -MSD) > FormatMaxPadding;
      }
    }
  }

  // Scientific formatting is pretty straightforward.
  if (FormatScientific) {
    exp += (NDigits - 1);

    Str.push_back(buffer[NDigits-1]);
    Str.push_back('.');
    if (NDigits == 1 && TruncateZero)
      Str.push_back('0');
    else
      for (unsigned I = 1; I != NDigits; ++I)
        Str.push_back(buffer[NDigits-1-I]);
    // Fill with zeros up to FormatPrecision.
    if (!TruncateZero && FormatPrecision > NDigits - 1)
      Str.append(FormatPrecision - NDigits + 1, '0');
    // For !TruncateZero we use lower 'e'.
    Str.push_back(TruncateZero ? 'E' : 'e');

    Str.push_back(exp >= 0 ? '+' : '-');
    if (exp < 0) exp = -exp;
    SmallVector<char, 6> expbuf;
    do {
      expbuf.push_back((char) ('0' + (exp % 10)));
      exp /= 10;
    } while (exp);
    // Exponent always at least two digits if we do not truncate zeros.
    if (!TruncateZero && expbuf.size() < 2)
      expbuf.push_back('0');
    for (unsigned I = 0, E = expbuf.size(); I != E; ++I)
      Str.push_back(expbuf[E-1-I]);
    return;
  }

  // Non-scientific, positive exponents.
  if (exp >= 0) {
    for (unsigned I = 0; I != NDigits; ++I)
      Str.push_back(buffer[NDigits-1-I]);
    for (unsigned I = 0; I != (unsigned) exp; ++I)
      Str.push_back('0');
    return;
  }

  // Non-scientific, negative exponents.

  // The number of digits to the left of the decimal point.
  int NWholeDigits = exp + (int) NDigits;

  unsigned I = 0;
  if (NWholeDigits > 0) {
    for (; I != (unsigned) NWholeDigits; ++I)
      Str.push_back(buffer[NDigits-I-1]);
    Str.push_back('.');
  } else {
    unsigned NZeros = 1 + (unsigned) -NWholeDigits;

    Str.push_back('0');
    Str.push_back('.');
    for (unsigned Z = 1; Z != NZeros; ++Z)
      Str.push_back('0');
  }

  for (; I != NDigits; ++I)
    Str.push_back(buffer[NDigits-I-1]);
}